

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O2

void __thiscall FString::Remove(FString *this,size_t index,size_t remlen)

{
  char *__src;
  char *pcVar1;
  ulong uVar2;
  size_t __n;
  ulong __n_00;
  FStringData *old;
  
  __src = this->Chars;
  uVar2 = (ulong)*(uint *)(__src + -0xc);
  if (index < uVar2) {
    if (uVar2 <= remlen + index) {
      Truncate(this,index);
      return;
    }
    __n_00 = uVar2 - remlen;
    if (remlen <= uVar2 - remlen) {
      __n_00 = remlen;
    }
    if (*(int *)(__src + -4) != 1) {
      AllocBuffer(this,uVar2 - __n_00);
      pcVar1 = this->Chars;
      memcpy(pcVar1,__src,index);
      pcVar1[index] = '\0';
      pcVar1 = this->Chars;
      __n = (ulong)*(uint *)(__src + -0xc) - (__n_00 + index);
      memcpy(pcVar1 + index,__src + __n_00 + index,__n);
      (pcVar1 + index)[__n] = '\0';
      FStringData::Release((FStringData *)(__src + -0xc));
      return;
    }
    memmove(__src + index,__src + index + __n_00,uVar2 - (index + __n_00));
    memset(this->Chars + (*(uint *)(this->Chars + -0xc) - __n_00),0,__n_00);
    *(int *)(this->Chars + -0xc) = *(int *)(this->Chars + -0xc) - (int)__n_00;
  }
  return;
}

Assistant:

void FString::Remove(size_t index, size_t remlen)
{
	if (index < Len())
	{
		if (index + remlen >= Len())
		{
			Truncate((long)index);
		}
		else
		{
			remlen = Len() - remlen < remlen ? Len() - remlen : remlen;
			if (Data()->RefCount == 1)
			{ // Can do this in place
				memmove(Chars + index, Chars + index + remlen, Len() - index - remlen);
				memset(Chars + Len() - remlen, 0, remlen);
				Data()->Len -= (unsigned)remlen;
			}
			else
			{ // Must do it in a copy
				FStringData *old = Data();
				AllocBuffer(old->Len - remlen);
				StrCopy(Chars, old->Chars(), index);
				StrCopy(Chars + index, old->Chars() + index + remlen, old->Len - index - remlen);
				old->Release();
			}
		}
	}
}